

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O3

bool __thiscall
google::protobuf::MessageLite::
ParseFrom<(google::protobuf::MessageLite::ParseFlags)1,google::protobuf::io::ZeroCopyInputStream*>
          (MessageLite *this,ZeroCopyInputStream **input)

{
  bool bVar1;
  int iVar2;
  
  (*this->_vptr_MessageLite[7])();
  bVar1 = internal::MergePartialFromImpl<false>(*input,this);
  if (bVar1) {
    iVar2 = (*this->_vptr_MessageLite[8])(this);
    if ((char)iVar2 != '\0') {
      return true;
    }
    LogInitializationErrorMessage(this);
  }
  return false;
}

Assistant:

bool MessageLite::ParseFrom(const T& input) {
  if (flags & kParse) Clear();
  constexpr bool alias = flags & kMergeWithAliasing;
  bool res = internal::MergePartialFromImpl<alias>(input, this);
  return res && ((flags & kMergePartial) || IsInitializedWithErrors());
}